

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.cpp
# Opt level: O2

void __thiscall
ear::Layout::Layout(Layout *this,string *name,
                   vector<ear::Channel,_std::allocator<ear::Channel>_> *channels,
                   optional<boost::variant<ear::PolarScreen,_ear::CartesianScreen>_> *screen)

{
  pointer pCVar1;
  
  std::__cxx11::string::string((string *)this,(string *)name);
  pCVar1 = (channels->super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  (this->_channels).super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>._M_impl.
  super__Vector_impl_data._M_start =
       (channels->super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>)._M_impl.
       super__Vector_impl_data._M_start;
  (this->_channels).super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>._M_impl.
  super__Vector_impl_data._M_finish = pCVar1;
  (this->_channels).super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (channels->super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>)._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (channels->super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (channels->super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (channels->super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  boost::optional_detail::optional_base<boost::variant<ear::PolarScreen,_ear::CartesianScreen>_>::
  optional_base(&(this->_screen).super_type,&screen->super_type);
  return;
}

Assistant:

Layout::Layout(std::string name, std::vector<Channel> channels,
                 boost::optional<Screen> screen)
      : _name(std::move(name)),
        _channels(std::move(channels)),
        _screen(screen){}